

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::recomputeBounds
          (iterator *this,uint32_t level)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  BranchNode<unsigned_long,_8U,_true> *this_00;
  int in_ESI;
  interval<unsigned_long> bounds;
  BranchNode<unsigned_long,_8U,_false> *branch_1;
  BranchNode<unsigned_long,_8U,_true> *branch;
  NodeRef child;
  interval<unsigned_long> *key;
  uint32_t offset;
  Path *path;
  BranchNode<unsigned_long,_8U,_false> *in_stack_ffffffffffffff98;
  uint32_t level_00;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *in_stack_ffffffffffffffa0;
  unsigned_long local_50;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
  *in_stack_ffffffffffffffc0;
  interval<unsigned_long> *local_28;
  int local_c;
  
  local_c = in_ESI;
  while (local_c != 0) {
    local_c = local_c + -1;
    puVar2 = IntervalMapDetails::Path::offset
                       ((Path *)in_stack_ffffffffffffffa0,
                        (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    uVar1 = *puVar2;
    IntervalMapDetails::NodeRef::NodeRef((NodeRef *)0xc0302f);
    level_00 = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (local_c == 0) {
      this_00 = IntervalMapDetails::Path::
                node<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
                          ((Path *)in_stack_ffffffffffffffa0,level_00);
      IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>::childAt(this_00,uVar1);
      local_28 = IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>::keyAt(this_00,uVar1);
    }
    else {
      in_stack_ffffffffffffffc0 =
           (NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
            *)IntervalMapDetails::Path::
              node<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                        ((Path *)in_stack_ffffffffffffffa0,level_00);
      IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>::childAt
                ((BranchNode<unsigned_long,_8U,_false> *)in_stack_ffffffffffffffc0,uVar1);
      local_28 = IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>::keyAt
                           ((BranchNode<unsigned_long,_8U,_false> *)in_stack_ffffffffffffffc0,uVar1)
      ;
    }
    uVar1 = IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffffa0);
    if (local_c == uVar1 - 1) {
      in_stack_ffffffffffffffa0 =
           IntervalMapDetails::NodeRef::
           get<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                     ((NodeRef *)in_stack_ffffffffffffffa0);
      IntervalMapDetails::NodeRef::size((NodeRef *)0xc030e8);
      _local_50 = IntervalMapDetails::
                  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                  ::getBounds(in_stack_ffffffffffffffc0,local_50._12_4_);
    }
    else {
      in_stack_ffffffffffffff98 =
           IntervalMapDetails::NodeRef::
           get<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                     ((NodeRef *)in_stack_ffffffffffffffa0);
      IntervalMapDetails::NodeRef::size((NodeRef *)0xc03118);
      _local_50 = IntervalMapDetails::
                  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                  ::getBounds((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                               *)in_stack_ffffffffffffffc0,local_50._12_4_);
    }
    local_28->left = local_50;
    local_28->right = local_50._8_8_;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::recomputeBounds(uint32_t level) {
    using namespace IntervalMapDetails;

    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        interval<TKey>* key;
        NodeRef child;

        if (level == 0) {
            auto& branch = path.template node<RootBranch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }
        else {
            auto& branch = path.template node<Branch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }

        auto bounds = (level == path.height() - 1)
                          ? child.template get<Leaf>().getBounds(child.size())
                          : child.template get<Branch>().getBounds(child.size());
        *key = bounds;
    }
}